

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O0

void __thiscall bsplib::A2A::clear(A2A *this)

{
  reference pvVar1;
  int local_14;
  int p;
  A2A *this_local;
  
  for (local_14 = 0; local_14 < this->m_nprocs; local_14 = local_14 + 1) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_recv_sizes,(long)local_14);
    *pvVar1 = 0;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_send_sizes,(long)local_14);
    *pvVar1 = 0;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_recv_pos,(long)local_14);
    *pvVar1 = 0;
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_send_pos,(long)local_14);
    *pvVar1 = 0;
  }
  return;
}

Assistant:

void A2A :: clear()
{
    for (int p = 0 ; p < m_nprocs; ++p ) {
        m_recv_sizes[p] = 0;
        m_send_sizes[p] = 0;
        m_recv_pos[p] = 0;
        m_send_pos[p] = 0;
    }
}